

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rungame.c
# Opt level: O0

int compare_filetime(void *arg1,void *arg2)

{
  char *__file;
  undefined1 local_148 [8];
  stat s2;
  stat s1;
  char *file2;
  char *file1;
  void *arg2_local;
  void *arg1_local;
  
  __file = *arg2;
  stat(*arg1,(stat *)(s2.__glibc_reserved + 2));
  stat(__file,(stat *)local_148);
  return (int)s2.st_atim.tv_nsec - (int)s1.st_atim.tv_nsec;
}

Assistant:

static int compare_filetime(const void *arg1, const void *arg2)
{
    const char *file1 = *(const char**)arg1;
    const char *file2 = *(const char**)arg2;
    
    struct stat s1, s2;
    
    stat(file1, &s1);
    stat(file2, &s2);
    
    return s2.st_mtime - s1.st_mtime;
}